

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O3

RunElement * __thiscall
duckdb::
MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
::StartGames(RunElement *__return_storage_ptr__,
            MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
            *this,Games *losers,RunElements *elements,RunElement *sentinel)

{
  pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *ppVar1;
  pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *ppVar2;
  long lVar3;
  pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *ppVar4;
  long lVar5;
  ulong *puVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *ppVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  long lVar15;
  Games winners;
  ulong auStack_320 [2];
  unsigned_long local_310;
  _Head_base<0UL,_unsigned_long,_false> _Stack_308;
  unsigned_long local_300;
  ulong auStack_2f8 [42];
  unsigned_long auStack_1a8 [48];
  
  lVar15 = 0;
  auStack_320[0] = 0xcd8f42;
  switchD_00569a20::default(auStack_320 + 2,0,0x2e8);
  lVar3 = 0;
  ppVar2 = elements->_M_elems;
  do {
    ppVar10 = elements->_M_elems + lVar3 * 2 + 1;
    uVar13 = *(ulong *)((long)&elements->_M_elems[0].first.
                               super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                               super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + lVar15 * 2
                       );
    uVar8 = *(ulong *)((long)&elements->_M_elems[1].first.
                              super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                              super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + lVar15 * 2)
    ;
    ppVar4 = ppVar2;
    ppVar1 = ppVar2;
    if (uVar8 <= uVar13) {
      if (uVar13 <= uVar8) {
        uVar12 = *(ulong *)((long)&elements->_M_elems[0].first.
                                   super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                                   super__Tuple_impl<1UL,_unsigned_long>.
                                   super__Head_base<1UL,_unsigned_long,_false>._M_head_impl +
                           lVar15 * 2);
        uVar9 = *(ulong *)((long)&elements->_M_elems[1].first.
                                  super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                                  super__Tuple_impl<1UL,_unsigned_long>.
                                  super__Head_base<1UL,_unsigned_long,_false>._M_head_impl +
                          lVar15 * 2);
        if ((uVar12 < uVar9) ||
           ((uVar12 <= uVar9 &&
            (*(ulong *)((long)&elements->_M_elems[0].second + lVar15 * 2) <
             *(ulong *)((long)&elements->_M_elems[1].second + lVar15 * 2))))) goto LAB_00cd8f82;
      }
      ppVar4 = ppVar10;
      uVar8 = uVar13;
      ppVar10 = ppVar2;
      ppVar1 = elements->_M_elems + lVar3 * 2 + 1;
    }
LAB_00cd8f82:
    *(ulong *)((long)&losers->_M_elems[0xf].first.
                      super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + lVar15) = uVar8;
    *(unsigned_long *)
     ((long)&losers->_M_elems[0xf].first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
             _M_head_impl + lVar15) =
         (((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&ppVar10->first)->first)
         .super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>
         .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
    *(unsigned_long *)((long)&losers->_M_elems[0xf].second + lVar15) = ppVar10->second;
    *(unsigned_long *)((long)auStack_1a8 + lVar15 + 8) =
         (((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&ppVar1->first)->first).
         super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
         super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    *(unsigned_long *)((long)auStack_1a8 + lVar15) =
         (((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&ppVar4->first)->first).
         super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
         super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
    *(unsigned_long *)((long)auStack_1a8 + lVar15 + 0x10) = ppVar4->second;
    lVar3 = lVar3 + 1;
    lVar15 = lVar15 + 0x18;
    ppVar2 = ppVar2 + 2;
  } while (lVar15 != 0x180);
  lVar3 = 0xe;
  lVar15 = 0xb0;
  lVar5 = 0x2b8;
  do {
    puVar14 = (ulong *)((long)auStack_320 + lVar5 + 0x10);
    puVar6 = auStack_2f8 + lVar3 * 6 + 3;
    uVar13 = *(ulong *)((long)&_Stack_308._M_head_impl + lVar5);
    uVar8 = *(ulong *)((long)auStack_2f8 + lVar5 + 8);
    if (uVar13 < uVar8) {
      uVar11 = *(ulong *)((long)auStack_2f8 + lVar5);
LAB_00cd905e:
      puVar7 = puVar14;
      uVar9 = uVar13;
      uVar12 = uVar11;
      uVar13 = uVar8;
      puVar14 = puVar6;
    }
    else {
      uVar12 = *puVar14;
      puVar7 = puVar6;
      uVar9 = uVar8;
      if ((uVar13 <= uVar8) &&
         ((uVar11 = *(ulong *)((long)auStack_2f8 + lVar5), uVar12 < uVar11 ||
          ((uVar12 <= uVar11 &&
           (*(ulong *)((long)auStack_2f8 + lVar5 + -8) <
            *(ulong *)((long)auStack_2f8 + lVar5 + 0x10))))))) goto LAB_00cd905e;
    }
    *(ulong *)((long)losers->_M_elems + lVar15 * 2 + -8) = uVar13;
    *(ulong *)((long)losers->_M_elems + lVar15 * 2 + -0x10) = uVar12;
    *(ulong *)((long)&losers->_M_elems[0].first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>
                      .super__Tuple_impl<1UL,_unsigned_long>.
                      super__Head_base<1UL,_unsigned_long,_false>._M_head_impl + lVar15 * 2) =
         puVar14[2];
    *(ulong *)((long)auStack_320 + lVar15 * 2 + 8) = uVar9;
    *(ulong *)((long)auStack_320 + lVar15 * 2) = *puVar7;
    *(ulong *)((long)auStack_320 + lVar15 * 2 + 0x10) = puVar7[2];
    lVar3 = lVar3 + -1;
    lVar15 = lVar15 + -0xc;
    lVar5 = lVar5 + -0x30;
    if (lVar5 == -0x18) {
      __return_storage_ptr__->second = local_300;
      (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = local_310;
      (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = _Stack_308._M_head_impl;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

RunElement StartGames(Games &losers, const RunElements &elements, const RunElement &sentinel) {
		const auto elem_nodes = elements.size();
		const auto game_nodes = losers.size();
		Games winners;

		//	Play the first round of games,
		//	placing the losers at the bottom of the game
		const auto base_offset = game_nodes / 2;
		auto losers_base = losers.data() + base_offset;
		auto winners_base = winners.data() + base_offset;

		const auto base_count = elem_nodes / 2;
		for (idx_t i = 0; i < base_count; ++i) {
			const auto &e0 = elements[i * 2 + 0];
			const auto &e1 = elements[i * 2 + 1];
			if (cmp(e0, e1)) {
				losers_base[i] = e1;
				winners_base[i] = e0;
			} else {
				losers_base[i] = e0;
				winners_base[i] = e1;
			}
		}

		//	Fill in any byes
		if (elem_nodes % 2) {
			winners_base[base_count] = elements.back();
			losers_base[base_count] = sentinel;
		}

		//	Pad to a power of 2
		const auto base_size = (game_nodes + 1) / 2;
		for (idx_t i = (elem_nodes + 1) / 2; i < base_size; ++i) {
			winners_base[i] = sentinel;
			losers_base[i] = sentinel;
		}

		//	Play the winners against each other
		//	and stick the losers in the upper levels of the tournament tree
		for (idx_t i = base_offset; i-- > 0;) {
			//	Indexing backwards
			const auto &e0 = winners[i * 2 + 1];
			const auto &e1 = winners[i * 2 + 2];
			if (cmp(e0, e1)) {
				losers[i] = e1;
				winners[i] = e0;
			} else {
				losers[i] = e0;
				winners[i] = e1;
			}
		}

		//	Return the final winner
		return winners[0];
	}